

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O3

u32 __thiscall moira::Moira::computeEA<(moira::Core)2,(moira::Mode)10,4,0ull>(Moira *this,u32 n)

{
  ushort uVar1;
  int iVar2;
  u32 uVar3;
  uint uVar4;
  u32 uVar5;
  u32 uVar6;
  u32 uVar7;
  ushort uVar8;
  int iVar9;
  
  if (7 < n) {
    __assert_fail("n < 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/MoiraDataflow_cpp.h"
                  ,0xb,
                  "u32 moira::Moira::computeEA(u32) [C = moira::Core::C68020, M = moira::Mode::IXPC, S = 4, F = 0ULL]"
                 );
  }
  uVar3 = (this->reg).pc;
  if (((this->queue).irc & 0x100) == 0) {
    uVar3 = computeEAbrief<(moira::Core)2,(moira::Mode)10,4,0ull>(this,uVar3);
    return uVar3;
  }
  uVar1 = (this->queue).irc;
  uVar5 = (this->reg).pc + 2;
  (this->reg).pc = uVar5;
  uVar5 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar5);
  (this->queue).irc = (u16)uVar5;
  uVar8 = uVar1 >> 4 & 3;
  if (uVar8 == 3) {
    uVar6 = readExt<(moira::Core)2,4>(this);
  }
  else {
    uVar6 = 0;
    if (uVar8 == 2) {
      uVar6 = (this->reg).pc + 2;
      (this->reg).pc = uVar6;
      uVar6 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar6);
      (this->queue).irc = (u16)uVar6;
      uVar6 = (u32)(short)(u16)uVar5;
    }
  }
  uVar8 = uVar1 & 3;
  if (uVar8 == 3) {
    uVar5 = readExt<(moira::Core)2,4>(this);
  }
  else {
    uVar5 = 0;
    if (uVar8 == 2) {
      uVar5 = (u32)(short)(this->queue).irc;
      uVar7 = (this->reg).pc + 2;
      (this->reg).pc = uVar7;
      uVar7 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar7);
      (this->queue).irc = (u16)uVar7;
    }
  }
  iVar9 = 0;
  if ((char)uVar1 < '\0') {
    uVar3 = 0;
  }
  if ((uVar1 & 0x40) == 0) {
    iVar2 = *(int *)((long)&(this->reg).field_3 + (ulong)(uVar1 >> 0xc) * 4);
    iVar9 = (int)(short)iVar2;
    if ((uVar1 >> 0xb & 1) != 0) {
      iVar9 = iVar2;
    }
    iVar9 = iVar9 << ((byte)(uVar1 >> 9) & 3);
  }
  if ((uVar1 & 4) == 0) {
    uVar3 = uVar6 + uVar3 + iVar9;
    if (uVar8 != 0) {
      uVar3 = read<(moira::Core)2,(moira::AddrSpace)2,4,0ull>(this,uVar3);
      uVar3 = uVar3 + uVar5;
    }
  }
  else {
    uVar3 = read<(moira::Core)2,(moira::AddrSpace)2,4,0ull>(this,uVar6 + uVar3);
    uVar3 = iVar9 + uVar5 + uVar3;
  }
  uVar4 = 0;
  if ((uVar1 >> 8 & 1) != 0) {
    uVar4 = (uint)(byte)(&DAT_00470950)[uVar1 & 0x3f];
  }
  this->cp = this->cp + uVar4;
  return uVar3;
}

Assistant:

u32
Moira::computeEA(u32 n) {

    assert(n < 8);

    u32 result;

    switch ((int)M) {

        case 0:  // Dn
        case 1:  // An
        {
            result = n;
            break;
        }
        case 2:  // (An)
        {
            result = readA(n);
            break;
        }
        case 3:  // (An)+
        {
            result = readA(n);
            break;
        }
        case 4:  // -(An)
        {
            if ((F & IMPL_DEC) == 0) SYNC(2);
            result = readA(n) - ((n == 7 && S == Byte) ? 2 : S);
            break;
        }
        case 5: // (d,An)
        {
            u32 an = readA(n);
            i16  d = (i16)queue.irc;

            result = U32_ADD(an, d);
            if ((F & SKIP_LAST_RD) == 0) { readExt<C>(); } else { reg.pc += 2; }
            break;
        }
        case 6: // (d,An,Xi)
        {
            if constexpr (C == Core::C68020) {

                if (queue.irc & 0x100) {
                    result = computeEAfull<C, M, S, F>(readA(n));
                } else {
                    result = computeEAbrief<C, M, S, F>(readA(n));
                }

            } else {

                i8   d = (i8)queue.irc;
                u32 an = readA(n);
                u32 xi = readR((queue.irc >> 12) & 0b1111);

                result = U32_ADD3(an, d, ((queue.irc & 0x800) ? xi : SEXT<Word>(xi)));

                SYNC(2);
                if ((F & SKIP_LAST_RD) == 0) { readExt<C>(); } else { reg.pc += 2; }
            }
            break;
        }
        case 7: // ABS.W
        {
            result = (i16)queue.irc;
            readBuffer = queue.irc;

            if ((F & SKIP_LAST_RD) == 0) { readExt<C>(); } else { reg.pc += 2; }
            break;
        }
        case 8: // ABS.L
        {
            result = queue.irc << 16;
            readExt<C>();
            result |= queue.irc;
            readBuffer = queue.irc;

            if ((F & SKIP_LAST_RD) == 0) { readExt<C>(); } else { reg.pc += 2; }
            break;
        }
        case 9: // (d,PC)
        {
            i16  d = (i16)queue.irc;

            result = U32_ADD(reg.pc, d);
            if ((F & SKIP_LAST_RD) == 0) { readExt<C>(); } else { reg.pc += 2; }
            break;
        }
        case 10: // (d,PC,Xi)
        {
            if constexpr (C == Core::C68020) {

                if (queue.irc & 0x100) {
                    result = computeEAfull<C, M, S, F>(reg.pc);
                } else {
                    result = computeEAbrief<C, M, S, F>(reg.pc);
                }

            } else {

                i8   d = (i8)queue.irc;
                u32 xi = readR((queue.irc >> 12) & 0b1111);

                result = U32_ADD3(reg.pc, d, ((queue.irc & 0x800) ? xi : SEXT<Word>(xi)));
                SYNC(2);
                if ((F & SKIP_LAST_RD) == 0) { readExt<C>(); } else { reg.pc += 2; }
            }
            break;
        }
        case 11: // Im
        {
            result = readI<C, S>();
            break;
        }
        default:
        {
            fatalError;
        }
    }
    return result;
}